

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManComputeCuts(Nf_Man_t *p)

{
  int iVar1;
  undefined8 uVar2;
  float *pfVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pGVar7 = p->pGia;
  if (0 < pGVar7->nObjs) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar2 = *(undefined8 *)(&pGVar7->pObjs->field_0x0 + lVar10);
      uVar5 = (uint)uVar2;
      if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
        if ((((int)uVar5 < 0) || (uVar5 = uVar5 & 0x1fffffff, uVar5 == 0x1fffffff)) ||
           (uVar5 != ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))) {
          Nf_ObjMergeOrder(p,(int)lVar9);
        }
        else {
          iVar6 = (int)((ulong)-uVar5 + lVar9);
          if ((iVar6 < 0) || (iVar1 = (p->vCutFlows).nSize, iVar1 <= iVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (iVar1 <= lVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
          }
          uVar8 = (ulong)-uVar5 + lVar9 & 0xffffffff;
          pfVar3 = (p->vCutFlows).pArray;
          pfVar3[lVar9] = pfVar3[uVar8];
          iVar1 = (p->vCutDelays).nSize;
          if (iVar1 <= iVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (iVar1 <= lVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar4 = (p->vCutDelays).pArray;
          piVar4[lVar9] = piVar4[uVar8];
        }
      }
      lVar9 = lVar9 + 1;
      pGVar7 = p->pGia;
      lVar10 = lVar10 + 0xc;
    } while (lVar9 < pGVar7->nObjs);
  }
  return;
}

Assistant:

void Nf_ManComputeCuts( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Nf_ObjSetCutFlow( p, i,  Nf_ObjCutFlow(p, iFanin) );
            Nf_ObjSetCutDelay( p, i, Nf_ObjCutDelay(p, iFanin) );
        }
        else
            Nf_ObjMergeOrder( p, i );
}